

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::ValidationState_t::CooperativeMatrixShapesMatch
          (ValidationState_t *this,Instruction *inst,uint32_t m1,uint32_t m2)

{
  Instruction *this_00;
  undefined4 uVar1;
  _Head_base<1UL,_bool,_false> _Var2;
  uint uVar3;
  uint uVar4;
  uint id;
  uint id_00;
  uint id_01;
  uint id_02;
  iterator iVar5;
  long lVar6;
  char *pcVar7;
  Instruction *this_01;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  local_208._0_4_ = m1;
  iVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,(key_type_conflict *)local_208);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    this_01 = (Instruction *)0x0;
  }
  else {
    this_01 = *(Instruction **)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                      ._M_cur + 0x10);
  }
  local_208._0_4_ = m2;
  iVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,(key_type_conflict *)local_208);
  this_00 = *(Instruction **)
             ((long)iVar5.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                    ._M_cur + 0x10);
  if ((this_01->inst_).opcode == (this_00->inst_).opcode) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(this_01,2);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(this_01,3);
    id = Instruction::GetOperandAs<unsigned_int>(this_01,4);
    id_00 = Instruction::GetOperandAs<unsigned_int>(this_00,2);
    id_01 = Instruction::GetOperandAs<unsigned_int>(this_00,3);
    id_02 = Instruction::GetOperandAs<unsigned_int>(this_00,4);
    EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar3);
    _Var2._M_head_impl = local_208[4];
    uVar1 = local_208._0_4_;
    EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_00);
    if (((_Var2._M_head_impl == true) && (local_208[4] != false)) && (uVar1 != local_208._0_4_)) {
      diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
      pcVar7 = "Expected scopes of Matrix and Result Type to be ";
      lVar6 = 0x30;
    }
    else {
      EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar4);
      _Var2._M_head_impl = local_208[4];
      uVar1 = local_208._0_4_;
      EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_01);
      if (((_Var2._M_head_impl == true) && (local_208[4] != false)) && (uVar1 != local_208._0_4_)) {
        diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
        pcVar7 = "Expected rows of Matrix type and Result Type to be ";
        lVar6 = 0x33;
      }
      else {
        EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id);
        _Var2._M_head_impl = local_208[4];
        uVar1 = local_208._0_4_;
        EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_02);
        if (((_Var2._M_head_impl == true) && (local_208[4] != false)) && (uVar1 != local_208._0_4_))
        {
          diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
          pcVar7 = "Expected columns of Matrix type and Result Type to be ";
          lVar6 = 0x36;
        }
        else {
          if ((this_01->inst_).opcode != 0x1168) {
            return SPV_SUCCESS;
          }
          uVar3 = Instruction::GetOperandAs<unsigned_int>(this_01,5);
          uVar4 = Instruction::GetOperandAs<unsigned_int>(this_00,5);
          EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar3);
          _Var2._M_head_impl = local_208[4];
          uVar1 = local_208._0_4_;
          EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar4);
          if (_Var2._M_head_impl != true) {
            return SPV_SUCCESS;
          }
          if (local_208[4] == false) {
            return SPV_SUCCESS;
          }
          if (uVar1 == local_208._0_4_) {
            return SPV_SUCCESS;
          }
          diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
          pcVar7 = "Expected Use of Matrix type and Result Type to be ";
          lVar6 = 0x32;
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar7,lVar6);
    pcVar7 = "identical";
    lVar6 = 9;
  }
  else {
    diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
    pcVar7 = "Expected cooperative matrix types";
    lVar6 = 0x21;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar7,lVar6);
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t ValidationState_t::CooperativeMatrixShapesMatch(
    const Instruction* inst, uint32_t m1, uint32_t m2) {
  const auto m1_type = FindDef(m1);
  const auto m2_type = FindDef(m2);

  if (m1_type->opcode() != m2_type->opcode()) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected cooperative matrix types";
  }

  uint32_t m1_scope_id = m1_type->GetOperandAs<uint32_t>(2);
  uint32_t m1_rows_id = m1_type->GetOperandAs<uint32_t>(3);
  uint32_t m1_cols_id = m1_type->GetOperandAs<uint32_t>(4);

  uint32_t m2_scope_id = m2_type->GetOperandAs<uint32_t>(2);
  uint32_t m2_rows_id = m2_type->GetOperandAs<uint32_t>(3);
  uint32_t m2_cols_id = m2_type->GetOperandAs<uint32_t>(4);

  bool m1_is_int32 = false, m1_is_const_int32 = false, m2_is_int32 = false,
       m2_is_const_int32 = false;
  uint32_t m1_value = 0, m2_value = 0;

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_scope_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_scope_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected scopes of Matrix and Result Type to be "
           << "identical";
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_rows_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_rows_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected rows of Matrix type and Result Type to be "
           << "identical";
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_cols_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_cols_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected columns of Matrix type and Result Type to be "
           << "identical";
  }

  if (m1_type->opcode() == spv::Op::OpTypeCooperativeMatrixKHR) {
    uint32_t m1_use_id = m1_type->GetOperandAs<uint32_t>(5);
    uint32_t m2_use_id = m2_type->GetOperandAs<uint32_t>(5);
    std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
        EvalInt32IfConst(m1_use_id);
    std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
        EvalInt32IfConst(m2_use_id);

    if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
      return diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Use of Matrix type and Result Type to be "
             << "identical";
    }
  }

  return SPV_SUCCESS;
}